

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitorTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSocketMonitorTests::TestUnsignal_SocketExists_WriteSocketErased::
~TestUnsignal_SocketExists_WriteSocketErased(TestUnsignal_SocketExists_WriteSocketErased *this)

{
  TestUnsignal_SocketExists_WriteSocketErased *this_local;
  
  ~TestUnsignal_SocketExists_WriteSocketErased(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(Unsignal_SocketExists_WriteSocketErased)
{
  SocketMonitor monitor;
  TestStrategy strategy;

  int socket = 101;
  monitor.addRead(socket);
  monitor.addWrite(socket);
  monitor.addConnect(socket);

  monitor.signal(socket);
  monitor.unsignal(socket);

  socket_close(socket);
}